

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  int iVar1;
  Column *p;
  
  p = pTable->aCol;
  if (p == (Column *)0x0) {
    return;
  }
  if (0 < pTable->nCol) {
    iVar1 = 0;
    do {
      if (p->zName != (char *)0x0) {
        sqlite3DbFreeNN(db,p->zName);
      }
      if (p->pDflt != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pDflt);
      }
      if (p->zColl != (char *)0x0) {
        sqlite3DbFreeNN(db,p->zColl);
      }
      iVar1 = iVar1 + 1;
      p = p + 1;
    } while (iVar1 < pTable->nCol);
    p = pTable->aCol;
    if (p == (Column *)0x0) {
      return;
    }
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}